

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 FixLargeWindowsWhenUndocking(ImVec2 *size,ImGuiViewport *ref_viewport)

{
  float fVar1;
  short sVar2;
  ImGuiPlatformMonitor *pIVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  
  if (ref_viewport != (ImGuiViewport *)0x0) {
    if ((GImGui->ConfigFlagsCurrFrame & 0x400) == 0) {
      fVar6 = (ref_viewport->WorkSize).x;
      fVar1 = (ref_viewport->WorkSize).y;
    }
    else {
      sVar2 = *(short *)&ref_viewport[1].WorkPos.y;
      if ((sVar2 < 0) || ((GImGui->PlatformIO).Monitors.Size <= (int)sVar2)) {
        pIVar3 = &GImGui->FallbackMonitor;
      }
      else {
        pIVar3 = (GImGui->PlatformIO).Monitors.Data + (uint)(int)sVar2;
      }
      fVar6 = (pIVar3->WorkSize).x;
      fVar1 = (pIVar3->WorkSize).y;
    }
    fVar4 = size->x;
    if ((float)(int)(fVar6 * 0.9) <= size->x) {
      fVar4 = (float)(int)(fVar6 * 0.9);
    }
    fVar6 = size->y;
    if ((float)(int)(fVar1 * 0.9) <= size->y) {
      fVar6 = (float)(int)(fVar1 * 0.9);
    }
    IVar5.y = fVar6;
    IVar5.x = fVar4;
    return IVar5;
  }
  return *size;
}

Assistant:

static ImVec2 FixLargeWindowsWhenUndocking(const ImVec2& size, ImGuiViewport* ref_viewport)
{
    if (ref_viewport == NULL)
        return size;

    ImGuiContext& g = *GImGui;
    ImVec2 max_size = ImFloor(ref_viewport->WorkSize * 0.90f);
    if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
    {
        const ImGuiPlatformMonitor* monitor = ImGui::GetViewportPlatformMonitor(ref_viewport);
        max_size = ImFloor(monitor->WorkSize * 0.90f);
    }
    return ImMin(size, max_size);
}